

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SincResampler.cpp
# Opt level: O2

uint SRCTools::SincResampler::Utils::greatestCommonDivisor(uint a,uint b)

{
  uint uVar1;
  
  while (uVar1 = b, uVar1 != 0) {
    b = a % uVar1;
    a = uVar1;
  }
  return a;
}

Assistant:

unsigned int Utils::greatestCommonDivisor(unsigned int a, unsigned int b) {
	while (0 < b) {
		unsigned int r = a % b;
		a = b;
		b = r;
	}
	return a;
}